

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jieba.hpp
# Opt level: O3

void __thiscall cppjieba::Jieba::ResetSeparators(Jieba *this,string *s)

{
  SegmentBase::ResetSeparators((SegmentBase *)&this->mp_seg_,s);
  SegmentBase::ResetSeparators(&(this->hmm_seg_).super_SegmentBase,s);
  SegmentBase::ResetSeparators((SegmentBase *)&this->mix_seg_,s);
  SegmentBase::ResetSeparators(&(this->full_seg_).super_SegmentBase,s);
  SegmentBase::ResetSeparators(&(this->query_seg_).super_SegmentBase,s);
  return;
}

Assistant:

void ResetSeparators(const string& s) {
    //TODO
    mp_seg_.ResetSeparators(s);
    hmm_seg_.ResetSeparators(s);
    mix_seg_.ResetSeparators(s);
    full_seg_.ResetSeparators(s);
    query_seg_.ResetSeparators(s);
  }